

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O3

void poly1305_donna::poly1305_update(poly1305_context *st,uchar *m,size_t bytes)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = st->leftover;
  if (sVar2 != 0) {
    uVar3 = 0x10 - sVar2;
    if (bytes <= 0x10 - sVar2) {
      uVar3 = bytes;
    }
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        st->buffer[uVar4 + st->leftover] = m[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
      sVar2 = st->leftover;
    }
    st->leftover = sVar2 + uVar3;
    if (sVar2 + uVar3 < 0x10) goto LAB_00769f76;
    m = m + uVar3;
    bytes = bytes - uVar3;
    poly1305_blocks(st,st->buffer,0x10);
    st->leftover = 0;
  }
  if (0xf < bytes) {
    poly1305_blocks(st,m,bytes & 0xfffffffffffffff0);
    m = m + (bytes & 0xfffffffffffffff0);
    bytes = (size_t)((uint)bytes & 0xf);
  }
  if (bytes != 0) {
    uVar3 = 0;
    do {
      st->buffer[uVar3 + st->leftover] = m[uVar3];
      uVar3 = uVar3 + 1;
    } while (bytes != uVar3);
    st->leftover = st->leftover + bytes;
  }
LAB_00769f76:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void poly1305_update(poly1305_context *st, const unsigned char *m, size_t bytes) noexcept {
    size_t i;

    /* handle leftover */
    if (st->leftover) {
        size_t want = (POLY1305_BLOCK_SIZE - st->leftover);
        if (want > bytes) {
            want = bytes;
        }
        for (i = 0; i < want; i++) {
            st->buffer[st->leftover + i] = m[i];
        }
        bytes -= want;
        m += want;
        st->leftover += want;
        if (st->leftover < POLY1305_BLOCK_SIZE) return;
        poly1305_blocks(st, st->buffer, POLY1305_BLOCK_SIZE);
        st->leftover = 0;
    }

    /* process full blocks */
    if (bytes >= POLY1305_BLOCK_SIZE) {
        size_t want = (bytes & ~(POLY1305_BLOCK_SIZE - 1));
        poly1305_blocks(st, m, want);
        m += want;
        bytes -= want;
    }

    /* store leftover */
    if (bytes) {
        for (i = 0; i < bytes; i++) {
            st->buffer[st->leftover + i] = m[i];
        }
        st->leftover += bytes;
    }
}